

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

void gpu_free_renderer_register(void)

{
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 10; local_c = local_c + 1) {
    _gpu_renderer_register[local_c].id.name = "Unknown";
    _gpu_renderer_register[local_c].id.renderer = 0;
    _gpu_renderer_register[local_c].createFn = (_func_GPU_Renderer_ptr_GPU_RendererID *)0x0;
    _gpu_renderer_register[local_c].freeFn = (_func_void_GPU_Renderer_ptr *)0x0;
  }
  for (local_c = 0; local_c < 0x14; local_c = local_c + 1) {
    _gpu_renderer_map[local_c] = (GPU_Renderer *)0x0;
  }
  _gpu_renderer_register_is_initialized = false;
  _gpu_renderer_order_size = 0;
  return;
}

Assistant:

void gpu_free_renderer_register(void)
{
	int i;

	for(i = 0; i < GPU_MAX_REGISTERED_RENDERERS; i++)
	{
		_gpu_renderer_register[i].id.name = "Unknown";
		_gpu_renderer_register[i].id.renderer = GPU_RENDERER_UNKNOWN;
		_gpu_renderer_register[i].createFn = NULL;
		_gpu_renderer_register[i].freeFn = NULL;
	}
	for(i = 0; i < GPU_MAX_ACTIVE_RENDERERS; i++)
	{
		_gpu_renderer_map[i] = NULL;
	}
	
	_gpu_renderer_register_is_initialized = 0;
	_gpu_renderer_order_size = 0;
}